

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
dynet::PickElement::backward_impl
          (PickElement *this,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Device_CPU *dev;
  
  dev = (Device_CPU *)fx->device;
  if (dev == (Device_CPU *)0x0) {
    __assert_fail("fx.device",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0x56d,
                  "virtual void dynet::PickElement::backward_impl(const std::vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  if ((dev->super_Device).type == CPU) {
    backward_dev_impl<dynet::Device_CPU>(this,dev,xs,fx,dEdf,i,dEdxi);
    return;
  }
  abort();
}

Assistant:

void PickNegLogSoftmax::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() == 1) {
    Tensor z(Dim({1},fx.d.bd), (float*)aux_mem, fx.device, DeviceMempool::FXS);
    Tensor m(Dim({1},fx.d.bd), (float*)aux_mem + fx.d.bd, fx.device, DeviceMempool::FXS);
    logsumexp(dev, *xs[0], m, z);
    if(pval) {
      fx.t<0>().device(*dev.edevice) = z.t<0>() - xs[0]->t<1>().chip<0>(*pval);
    } else {
      assert(pvals);
      assert(pvals->size() == fx.d.batch_elems());
      int batch_size = xs[0]->d.batch_size();
      for(unsigned b = 0; b < pvals->size(); ++b)
        TensorTools::CopyElement(*xs[0], batch_size * b + (*pvals)[b], fx, b);
      fx.tvec().device(*dev.edevice) = z.tvec() - fx.tvec();
    }
  } else {
    throw std::runtime_error("PickNegLogSoftmax::forward not yet implemented for multiple columns");
  }
}